

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::typeParametersCheck
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  TBasicType t;
  TVector<glslang::TArraySize> *pTVar1;
  TArraySizes *pTVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  if ((this->super_TParseContextBase).parsingBuiltins != false) {
    return;
  }
  if ((publicType->field_0xb9 & 0x20) != 0) {
    if (publicType->typeParameters == (TTypeParameters *)0x0) {
      pcVar3 = "coopmat missing type parameters";
      goto LAB_00434604;
    }
    t = publicType->typeParameters->basicType;
    if (((6 < t - EbtFloat16) && (t != EbtFloat)) && (t != EbtSpirvType)) {
      pcVar3 = TType::getBasicString(t);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"coopmat invalid basic type",pcVar3,"");
    }
    pTVar2 = publicType->typeParameters->arraySizes;
    pTVar1 = (pTVar2->sizes).sizes;
    pcVar3 = "coopmat incorrect number of type parameters";
    if ((pTVar1 == (TVector<glslang::TArraySize> *)0x0) ||
       (((long)(pTVar1->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pTVar1->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
               ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) != 0x40))
    goto LAB_00434604;
    uVar5 = TSmallArrayVector::getDimSize(&pTVar2->sizes,3);
    if (2 < uVar5) {
      pcVar3 = "coopmat invalid matrix Use";
      goto LAB_00434604;
    }
  }
  if (publicType->basicType == EbtTensorLayoutNV) {
    if (publicType->typeParameters == (TTypeParameters *)0x0) {
      pcVar3 = "tensorLayout missing type parameters";
      goto LAB_00434604;
    }
    pTVar1 = (publicType->typeParameters->arraySizes->sizes).sizes;
    if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
      if (2 < (int)((ulong)((long)(pTVar1->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        pcVar3 = "tensorLayout incorrect number of type parameters";
        goto LAB_00434604;
      }
      if ((pTVar1 != (TVector<glslang::TArraySize> *)0x0) &&
         (1 < (int)((ulong)((long)(pTVar1->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4)))
      goto LAB_00434539;
    }
    while( true ) {
      pTVar2 = publicType->typeParameters->arraySizes;
      pTVar1 = (pTVar2->sizes).sizes;
      if ((pTVar1 != (TVector<glslang::TArraySize> *)0x0) &&
         (1 < (int)((ulong)((long)(pTVar1->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4))) break;
      TSmallArrayVector::push_back(&pTVar2->sizes,0,(TIntermTyped *)0x0);
    }
  }
LAB_00434539:
  if (publicType->basicType != EbtTensorViewNV) {
    return;
  }
  if (publicType->typeParameters == (TTypeParameters *)0x0) {
    pcVar3 = "tensorView missing type parameters";
  }
  else {
    pTVar1 = (publicType->typeParameters->arraySizes->sizes).sizes;
    pcVar3 = "tensorView incorrect number of type parameters";
    if ((pTVar1 != (TVector<glslang::TArraySize> *)0x0) &&
       (0 < (int)((ulong)((long)(pTVar1->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar1->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
      uVar6 = 0;
      if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
        if (7 < (int)((ulong)((long)(pTVar1->
                                    super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ).
                                    super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar1->
                                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ).
                                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4))
        goto LAB_00434604;
        if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
          if (6 < (int)((ulong)((long)(pTVar1->
                                      super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                      ).
                                      super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar1->
                                     super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ).
                                     super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
            return;
          }
          if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
            uVar6 = (ulong)((long)(pTVar1->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4;
          }
        }
      }
      if (6 < (uint)uVar6) {
        return;
      }
      iVar4 = (uint)uVar6 - 1;
      do {
        uVar5 = (int)uVar6 - 2;
        if (iVar4 == 0) {
          uVar5 = 0;
        }
        TSmallArrayVector::push_back
                  (&publicType->typeParameters->arraySizes->sizes,uVar5,(TIntermTyped *)0x0);
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        iVar4 = iVar4 + 1;
      } while (uVar5 != 7);
      return;
    }
  }
LAB_00434604:
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar3,"","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::typeParametersCheck(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (parsingBuiltins)
        return;
    if (publicType.isCoopmatKHR()) {
        if (publicType.typeParameters == nullptr) {
            error(loc, "coopmat missing type parameters", "", "");
            return;
        }
        switch (publicType.typeParameters->basicType) {
        case EbtFloat:
        case EbtFloat16:
        case EbtInt:
        case EbtInt8:
        case EbtInt16:
        case EbtUint:
        case EbtUint8:
        case EbtUint16:
        case EbtSpirvType:
            break;
        default:
            error(loc, "coopmat invalid basic type", TType::getBasicString(publicType.typeParameters->basicType), "");
            break;
        }
        if (publicType.typeParameters->arraySizes->getNumDims() != 4) {
            error(loc, "coopmat incorrect number of type parameters", "", "");
            return;
        }
        int use = publicType.typeParameters->arraySizes->getDimSize(3);
        if (use < 0 || use > 2) {
            error(loc, "coopmat invalid matrix Use", "", "");
            return;
        }
    }
    if (publicType.isTensorLayoutNV()) {
        if (publicType.typeParameters == nullptr) {
            error(loc, "tensorLayout missing type parameters", "", "");
            return;
        }
        if (publicType.typeParameters->arraySizes->getNumDims() > 2) {
            error(loc, "tensorLayout incorrect number of type parameters", "", "");
            return;
        }
        if (publicType.typeParameters && publicType.typeParameters->arraySizes->getNumDims() < 2) {
            while (publicType.typeParameters->arraySizes->getNumDims() < 2) {
                publicType.typeParameters->arraySizes->addInnerSize(0);
            }
        }
    }
    if (publicType.isTensorViewNV()) {
        if (publicType.typeParameters == nullptr) {
            error(loc, "tensorView missing type parameters", "", "");
            return;
        }
        if (publicType.typeParameters->arraySizes->getNumDims() < 1 ||
            publicType.typeParameters->arraySizes->getNumDims() > 7) {
            error(loc, "tensorView incorrect number of type parameters", "", "");
            return;
        }
        if (publicType.typeParameters && publicType.typeParameters->arraySizes->getNumDims() < 7) {
            uint32_t numDims = publicType.typeParameters->arraySizes->getNumDims();
            while (numDims < 7) {
                uint32_t dim = (numDims == 1) ? 0 : (numDims - 2);
                publicType.typeParameters->arraySizes->addInnerSize(dim);
                numDims++;
            }
        }
    }
}